

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O2

void deqp::gles2::Performance::writeConditionalWorkload
               (ostringstream *stream,char *resultName,char *operandName)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  poVar1 = std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,resultName);
  std::operator<<(poVar1," = ");
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      if (iVar2 == 0x40) {
        std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,";");
        return;
      }
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"*");
    }
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,operandName);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static void writeConditionalWorkload (std::ostringstream& stream, const char* resultName, const char* operandName)
{
	const int numMultiplications = 64;

	stream << resultName << " = ";

	for (int i = 0; i < numMultiplications; i++)
	{
		if (i > 0)
			stream << "*";

		stream << operandName;
	}

	stream << ";";
}